

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cal_inertial_and_magnetic_data.cpp
# Opt level: O2

Vector3f __thiscall
ximu::CalInertialAndMagneticData::accelerometer(CalInertialAndMagneticData *this)

{
  float fVar1;
  float *in_RDI;
  float in_XMM1_Da;
  Vector3f VVar2;
  
  *in_RDI = (this->_accelerometer)._x;
  in_RDI[1] = (this->_accelerometer)._y;
  fVar1 = (this->_accelerometer)._z;
  VVar2._y = 0.0;
  VVar2._x = fVar1;
  in_RDI[2] = fVar1;
  VVar2._z = in_XMM1_Da;
  return VVar2;
}

Assistant:

Vector3f CalInertialAndMagneticData::accelerometer() const {
  return _accelerometer;
}